

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O0

bool RetryAsync(SSL *ssl,int ret)

{
  bool bVar1;
  int iVar2;
  TestConfig *pTVar3;
  TestState *pTVar4;
  pointer this;
  timeval *ptVar5;
  int timeout_ret_1;
  timeval *clock;
  int timeout_ret;
  int ssl_err;
  TestState *test_state;
  TestConfig *config;
  int ret_local;
  SSL *ssl_local;
  
  pTVar3 = GetTestConfig(ssl);
  pTVar4 = GetTestState(ssl);
  if (ret < 0) {
    clock._4_4_ = SSL_get_error((SSL *)ssl,ret);
    if ((clock._4_4_ == 0x13) && ((pTVar3->renegotiate_explicit & 1U) != 0)) {
      pTVar4->explicit_renegotiates = pTVar4->explicit_renegotiates + 1;
      iVar2 = SSL_renegotiate((SSL *)ssl);
      ssl_local._7_1_ = iVar2 != 0;
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pTVar4->quic_transport);
      if ((bVar1) && (clock._4_4_ == 2)) {
        this = std::unique_ptr<MockQuicTransport,_std::default_delete<MockQuicTransport>_>::
               operator->(&pTVar4->quic_transport);
        ssl_local._7_1_ = MockQuicTransport::ReadHandshake(this);
      }
      else if ((pTVar3->async & 1U) == 0) {
        ssl_local._7_1_ = false;
      }
      else {
        if ((pTVar4->packeted_bio != (BIO *)0x0) &&
           (bVar1 = PacketedBioAdvanceClock(pTVar4->packeted_bio), bVar1)) {
          iVar2 = DTLSv1_handle_timeout(ssl);
          if (-1 < iVar2) {
            return true;
          }
          clock._4_4_ = SSL_get_error((SSL *)ssl,iVar2);
        }
        switch(clock._4_4_) {
        case 2:
          AsyncBioAllowRead(pTVar4->async_bio,1);
          ssl_local._7_1_ = true;
          break;
        case 3:
          AsyncBioAllowWrite(pTVar4->async_bio,1);
          ssl_local._7_1_ = true;
          break;
        case 4:
          pTVar4->cert_ready = true;
          ssl_local._7_1_ = true;
          break;
        default:
          ssl_local._7_1_ = false;
          break;
        case 0xb:
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                    (&pTVar4->session,&pTVar4->pending_session);
          ssl_local._7_1_ = true;
          break;
        case 0xc:
          pTVar4->early_callback_ready = true;
          ssl_local._7_1_ = true;
          break;
        case 0xd:
          pTVar4->private_key_retries = pTVar4->private_key_retries + 1;
          if ((pTVar3->private_key_delay_ms != 0) && (pTVar4->private_key_retries == 1)) {
            if (pTVar4->packeted_bio == (BIO *)0x0) {
              fprintf(_stderr,"-private-key-delay-ms requires DTLS.\n");
              return false;
            }
            ptVar5 = PacketedBioGetClock(pTVar4->packeted_bio);
            ptVar5->tv_sec = (long)(pTVar3->private_key_delay_ms / 1000) + ptVar5->tv_sec;
            ptVar5->tv_usec = (long)(pTVar3->private_key_delay_ms * 1000) + ptVar5->tv_usec;
            if (999999 < ptVar5->tv_usec) {
              ptVar5->tv_usec = ptVar5->tv_usec + -1000000;
              ptVar5->tv_sec = ptVar5->tv_sec + 1;
            }
            iVar2 = DTLSv1_handle_timeout(ssl);
            if (iVar2 < 0) {
              iVar2 = SSL_get_error((SSL *)ssl,iVar2);
              if (iVar2 == 3) {
                AsyncBioAllowWrite(pTVar4->async_bio,1);
                return true;
              }
              return false;
            }
          }
          ssl_local._7_1_ = true;
          break;
        case 0xe:
          pTVar4->async_ticket_decrypt_ready = true;
          ssl_local._7_1_ = true;
          break;
        case 0x10:
          pTVar4->custom_verify_ready = true;
          ssl_local._7_1_ = true;
        }
      }
    }
  }
  else {
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

bool RetryAsync(SSL *ssl, int ret) {
  const TestConfig *config = GetTestConfig(ssl);
  TestState *test_state = GetTestState(ssl);
  if (ret >= 0) {
    return false;
  }

  int ssl_err = SSL_get_error(ssl, ret);
  if (ssl_err == SSL_ERROR_WANT_RENEGOTIATE && config->renegotiate_explicit) {
    test_state->explicit_renegotiates++;
    return SSL_renegotiate(ssl);
  }

  if (test_state->quic_transport && ssl_err == SSL_ERROR_WANT_READ) {
    return test_state->quic_transport->ReadHandshake();
  }

  if (!config->async) {
    // Only asynchronous tests should trigger other retries.
    return false;
  }

  if (test_state->packeted_bio != nullptr &&
      PacketedBioAdvanceClock(test_state->packeted_bio)) {
    int timeout_ret = DTLSv1_handle_timeout(ssl);
    if (timeout_ret >= 0) {
      return true;
    }
    ssl_err = SSL_get_error(ssl, timeout_ret);
  }

  // See if we needed to read or write more. If so, allow one byte through on
  // the appropriate end to maximally stress the state machine.
  switch (ssl_err) {
    case SSL_ERROR_WANT_READ:
      AsyncBioAllowRead(test_state->async_bio, 1);
      return true;
    case SSL_ERROR_WANT_WRITE:
      AsyncBioAllowWrite(test_state->async_bio, 1);
      return true;
    case SSL_ERROR_WANT_X509_LOOKUP:
      test_state->cert_ready = true;
      return true;
    case SSL_ERROR_PENDING_SESSION:
      test_state->session = std::move(test_state->pending_session);
      return true;
    case SSL_ERROR_PENDING_CERTIFICATE:
      test_state->early_callback_ready = true;
      return true;
    case SSL_ERROR_WANT_PRIVATE_KEY_OPERATION:
      test_state->private_key_retries++;
      if (config->private_key_delay_ms != 0 &&
          test_state->private_key_retries == 1) {
        // The first time around, simulate the private key operation taking a
        // long time to run.
        if (test_state->packeted_bio == nullptr) {
          fprintf(stderr, "-private-key-delay-ms requires DTLS.\n");
          return false;
        }
        timeval *clock = PacketedBioGetClock(test_state->packeted_bio);
        clock->tv_sec += config->private_key_delay_ms / 1000;
        clock->tv_usec += config->private_key_delay_ms * 1000;
        if (clock->tv_usec >= 1000000) {
          clock->tv_usec -= 1000000;
          clock->tv_sec++;
        }
        int timeout_ret = DTLSv1_handle_timeout(ssl);
        if (timeout_ret < 0) {
          if (SSL_get_error(ssl, timeout_ret) == SSL_ERROR_WANT_WRITE) {
            AsyncBioAllowWrite(test_state->async_bio, 1);
            return true;
          }
          return false;
        }
      }
      return true;
    case SSL_ERROR_WANT_CERTIFICATE_VERIFY:
      test_state->custom_verify_ready = true;
      return true;
    case SSL_ERROR_PENDING_TICKET:
      test_state->async_ticket_decrypt_ready = true;
      return true;
    default:
      return false;
  }
}